

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

uint fmt::v5::internal::
     parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&,char>&>
               (null_terminating_iterator<char> *it,
               precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
               *eh)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  
  pcVar1 = it->ptr_;
  if (((pcVar1 == it->end_) || (*pcVar1 < '0')) || ((pcVar1 != it->end_ && ('9' < *pcVar1)))) {
    __assert_fail("\'0\' <= *it && *it <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format.h"
                  ,0x624,
                  "unsigned int fmt::internal::parse_nonnegative_int(Iterator &, ErrorHandler &&) [Iterator = fmt::internal::null_terminating_iterator<char>, ErrorHandler = fmt::internal::precision_adapter<fmt::internal::specs_checker<fmt::internal::dynamic_specs_handler<fmt::basic_parse_context<char>>> &, char> &]"
                 );
  }
  pcVar1 = it->end_;
  uVar5 = 0;
  pcVar2 = it->ptr_;
  do {
    pcVar3 = pcVar2 + 1;
    if (pcVar2 == pcVar1) {
      iVar4 = -0x30;
    }
    else {
      iVar4 = *pcVar2 + -0x30;
    }
    uVar5 = uVar5 * 10 + iVar4;
    it->ptr_ = pcVar3;
    if (((pcVar3 == pcVar1) || (*pcVar3 < '0')) || ((pcVar3 != pcVar1 && ('9' < *pcVar3))))
    goto LAB_001312f5;
    pcVar2 = pcVar3;
  } while (uVar5 < 0xccccccd);
  uVar5 = 0x80000000;
LAB_001312f5:
  if ((int)uVar5 < 0) {
    basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
              ((eh->handler->
               super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
               ).context_,"number is too big");
  }
  return uVar5;
}

Assistant:

FMT_CONSTEXPR Char operator*() const {
    return ptr_ != end_ ? *ptr_ : 0;
  }